

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

BOOL read_repeat_counts(PCRE2_SPTR8 *ptrptr,PCRE2_SPTR8 ptrend,uint32_t *minp,uint32_t *maxp,
                       int *errorcodeptr)

{
  byte bVar1;
  uint uVar2;
  BOOL BVar3;
  int iVar4;
  PCRE2_SPTR8 ptr;
  byte *pbVar5;
  byte *pbVar6;
  PCRE2_SPTR8 pPVar7;
  uint uVar8;
  byte *pbVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  pbVar5 = *ptrptr;
  *errorcodeptr = 0;
  bVar13 = true;
  bVar11 = pbVar5 < ptrend;
  pbVar6 = pbVar5;
  pbVar9 = pbVar5;
  if (bVar11) {
    do {
      if ((*pbVar5 != 0x20) && (*pbVar5 != 9)) {
        pbVar6 = pbVar5;
        pbVar9 = pbVar5;
        if ((bVar11) && ((byte)(*pbVar5 - 0x30) < 10)) {
          bVar13 = false;
          goto LAB_0013cc38;
        }
        break;
      }
      pbVar5 = pbVar5 + 1;
      bVar11 = pbVar5 < ptrend;
      pbVar6 = ptrend;
      pbVar9 = ptrend;
    } while (pbVar5 != ptrend);
  }
  goto LAB_0013cc5a;
  while( true ) {
    pbVar5 = pbVar5 + 1;
    uVar8 = ((uint)bVar1 + uVar8 * 10) - 0x30;
    iVar4 = 0x69;
    pbVar9 = pbVar5;
    if (0xffff < uVar8) break;
LAB_0013cf30:
    if ((ptrend <= pbVar5) || (bVar1 = *pbVar5, 9 < (byte)(bVar1 - 0x30))) {
      bVar13 = false;
      goto LAB_0013ce10;
    }
  }
  goto LAB_0013ce0a;
  while( true ) {
    pbVar5 = pbVar5 + 1;
    uVar8 = ((uint)bVar1 + uVar8 * 10) - 0x30;
    iVar4 = 0x69;
    if (0xffff < uVar8) break;
LAB_0013cf98:
    if ((ptrend <= pbVar5) || (bVar1 = *pbVar5, 9 < (byte)(bVar1 - 0x30))) {
      bVar13 = false;
      goto LAB_0013ce70;
    }
  }
  goto LAB_0013ce6a;
  while ((byte)(*pbVar9 - 0x30) < 10) {
LAB_0013cc38:
    pbVar9 = pbVar9 + 1;
    if (ptrend <= pbVar9) {
      bVar13 = false;
      break;
    }
  }
LAB_0013cc5a:
  bVar12 = pbVar9 < ptrend;
  if (!bVar12) {
    return 0;
  }
  lVar10 = (long)ptrend - (long)pbVar9;
  while( true ) {
    pbVar5 = pbVar9 + 1;
    if ((*pbVar9 != 0x20) && (*pbVar9 != 9)) break;
    bVar12 = pbVar5 < ptrend;
    lVar10 = lVar10 + -1;
    pbVar9 = pbVar5;
    if (lVar10 == 0) {
      return 0;
    }
  }
  if (!bVar12) {
    return 0;
  }
  if (*pbVar9 == 0x7d) {
    if (bVar13) {
      return 0;
    }
  }
  else {
    if (*pbVar9 != 0x2c) {
      return 0;
    }
    while( true ) {
      if (ptrend <= pbVar5) {
        return 0;
      }
      if ((*pbVar5 != 0x20) && (*pbVar5 != 9)) break;
      pbVar5 = pbVar5 + 1;
    }
    if (ptrend <= pbVar5) {
      return 0;
    }
    if ((byte)(*pbVar5 - 0x30) < 10) {
      do {
        pbVar5 = pbVar5 + 1;
        if (ptrend <= pbVar5) break;
      } while ((byte)(*pbVar5 - 0x30) < 10);
    }
    else if (bVar13) {
      return 0;
    }
    bVar13 = pbVar5 < ptrend;
    if (!bVar13) {
      return 0;
    }
    lVar10 = (long)ptrend - (long)pbVar5;
    while( true ) {
      if ((*pbVar5 != 0x20) && (*pbVar5 != 9)) break;
      bVar13 = pbVar5 + 1 < ptrend;
      lVar10 = lVar10 + -1;
      pbVar5 = pbVar5 + 1;
      if (lVar10 == 0) {
        return 0;
      }
    }
    if (!bVar13) {
      return 0;
    }
    if (*pbVar5 != 0x7d) {
      return 0;
    }
  }
  *errorcodeptr = 0;
  bVar13 = true;
  uVar2 = 0;
  if ((bVar11) && (uVar2 = 0, (byte)(*pbVar6 - 0x30) < 10)) {
    uVar2 = 0;
    do {
      if ((ptrend <= pbVar6) || (bVar1 = *pbVar6, 9 < (byte)(bVar1 - 0x30))) {
        bVar13 = false;
        goto LAB_0013cd7f;
      }
      pbVar6 = pbVar6 + 1;
      uVar2 = ((uint)bVar1 + uVar2 * 10) - 0x30;
    } while (uVar2 < 0x10000);
    *errorcodeptr = 0x69;
  }
LAB_0013cd7f:
  if (bVar13) {
    if (*errorcodeptr != 0) {
      BVar3 = 0;
      goto LAB_0013cec2;
    }
    pbVar5 = pbVar6 + 1;
    iVar4 = 0;
    uVar8 = 0x10000;
    bVar11 = pbVar5 < ptrend;
    if (bVar11) {
      pPVar7 = ptrend + ~(ulong)pbVar6;
      pbVar9 = pbVar5;
      do {
        pbVar5 = pbVar9;
        if ((*pbVar5 != 0x20) && (*pbVar5 != 9)) {
          *errorcodeptr = 0;
          bVar13 = true;
          uVar8 = 0x10000;
          if ((!bVar11) || (9 < (byte)(*pbVar5 - 0x30))) goto LAB_0013ce70;
          uVar8 = 0;
          goto LAB_0013cf98;
        }
        pbVar9 = pbVar5 + 1;
        bVar11 = pbVar9 < ptrend;
        pPVar7 = pPVar7 + -1;
        pbVar5 = ptrend;
      } while (pPVar7 != (PCRE2_SPTR8)0x0);
    }
LAB_0013ce6a:
    *errorcodeptr = iVar4;
    bVar13 = true;
LAB_0013ce70:
    if ((bVar13) && (pbVar6 = pbVar5, *errorcodeptr != 0)) goto LAB_0013ce7b;
  }
  else {
    pbVar5 = pbVar6;
    if (pbVar6 < ptrend) {
      lVar10 = (long)ptrend - (long)pbVar6;
      do {
        if ((*pbVar6 != 0x20) && (pbVar5 = pbVar6, *pbVar6 != 9)) break;
        pbVar6 = pbVar6 + 1;
        lVar10 = lVar10 + -1;
        pbVar5 = ptrend;
      } while (lVar10 != 0);
    }
    uVar8 = uVar2;
    if (*pbVar5 != 0x7d) {
      pbVar9 = pbVar5 + 1;
      iVar4 = 0;
      uVar8 = 0x10000;
      bVar11 = pbVar9 < ptrend;
      if (bVar11) {
        pPVar7 = ptrend + ~(ulong)pbVar5;
        pbVar5 = pbVar9;
        do {
          if ((*pbVar5 != 0x20) && (*pbVar5 != 9)) {
            *errorcodeptr = 0;
            bVar13 = true;
            uVar8 = 0x10000;
            if ((!bVar11) || (9 < (byte)(*pbVar5 - 0x30))) goto LAB_0013ce10;
            uVar8 = 0;
            goto LAB_0013cf30;
          }
          pbVar5 = pbVar5 + 1;
          bVar11 = pbVar5 < ptrend;
          pPVar7 = pPVar7 + -1;
          pbVar9 = ptrend;
        } while (pPVar7 != (PCRE2_SPTR8)0x0);
      }
LAB_0013ce0a:
      *errorcodeptr = iVar4;
      bVar13 = true;
      pbVar5 = pbVar9;
LAB_0013ce10:
      pbVar6 = pbVar5;
      if ((!bVar13) || (*errorcodeptr == 0)) {
        if ((int)uVar2 <= (int)uVar8) goto LAB_0013ce85;
        *errorcodeptr = 0x68;
      }
LAB_0013ce7b:
      BVar3 = 0;
      goto LAB_0013cec2;
    }
  }
LAB_0013ce85:
  pbVar6 = pbVar5;
  if (pbVar5 < ptrend) {
    lVar10 = (long)ptrend - (long)pbVar5;
    do {
      if ((*pbVar5 != 0x20) && (pbVar6 = pbVar5, *pbVar5 != 9)) break;
      pbVar5 = pbVar5 + 1;
      lVar10 = lVar10 + -1;
      pbVar6 = ptrend;
    } while (lVar10 != 0);
  }
  if (minp != (uint32_t *)0x0) {
    *minp = uVar2;
  }
  pbVar6 = pbVar6 + 1;
  BVar3 = 1;
  if (maxp != (uint32_t *)0x0) {
    *maxp = uVar8;
  }
LAB_0013cec2:
  *ptrptr = pbVar6;
  return BVar3;
}

Assistant:

static BOOL
read_repeat_counts(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t *minp,
  uint32_t *maxp, int *errorcodeptr)
{
PCRE2_SPTR p = *ptrptr;
PCRE2_SPTR pp;
BOOL yield = FALSE;
BOOL had_minimum = FALSE;
int32_t min = 0;
int32_t max = REPEAT_UNLIMITED; /* This value is larger than MAX_REPEAT_COUNT */

*errorcodeptr = 0;
while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;

/* Check the syntax before interpreting. Otherwise, a non-quantifier sequence
such as "X{123456ABC" would incorrectly give a "number too big in quantifier"
error. */

pp = p;
if (pp < ptrend && IS_DIGIT(*pp))
  {
  had_minimum = TRUE;
  while (++pp < ptrend && IS_DIGIT(*pp)) {}
  }

while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
if (pp >= ptrend) return FALSE;

if (*pp == CHAR_RIGHT_CURLY_BRACKET)
  {
  if (!had_minimum) return FALSE;
  }
else
  {
  if (*pp++ != CHAR_COMMA) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend) return FALSE;
  if (IS_DIGIT(*pp))
    {
    while (++pp < ptrend && IS_DIGIT(*pp)) {}
    }
  else if (!had_minimum) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend || *pp != CHAR_RIGHT_CURLY_BRACKET) return FALSE;
  }

/* Now process the quantifier for real. We know it must be {n} or (n,} or {,m}
or {n,m}. The only error that read_number() can return is for a number that is
too big. If *errorcodeptr is returned as zero it means no number was found. */

/* Deal with {,m} or n too big. If we successfully read m there is no need to
check m >= n because n defaults to zero. */

if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &min, errorcodeptr))
  {
  if (*errorcodeptr != 0) goto EXIT;    /* n too big */
  p++;  /* Skip comma and subsequent spaces */
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
    {
    if (*errorcodeptr != 0) goto EXIT;  /* m too big */
    }
  }

/* Have read one number. Deal with {n} or {n,} or {n,m} */

else
  {
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (*p == CHAR_RIGHT_CURLY_BRACKET)
    {
    max = min;
    }
  else   /* Handle {n,} or {n,m} */
    {
    p++;    /* Skip comma and subsequent spaces */
    while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
    if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
      {
      if (*errorcodeptr != 0) goto EXIT;   /* m too big */
      }

    if (max < min)
      {
      *errorcodeptr = ERR4;
      goto EXIT;
      }
    }
  }

/* Valid quantifier exists */

while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
p++;
yield = TRUE;
if (minp != NULL) *minp = (uint32_t)min;
if (maxp != NULL) *maxp = (uint32_t)max;

/* Update the pattern pointer */

EXIT:
*ptrptr = p;
return yield;
}